

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassicSudokuVisualizer.cpp
# Opt level: O3

string * __thiscall
ClassicSudokuVisualizer::createCells_abi_cxx11_
          (string *__return_storage_ptr__,ClassicSudokuVisualizer *this)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  cell cVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint __val;
  string __str;
  uint local_6c;
  char *local_68;
  uint local_60;
  char local_58 [20];
  uint local_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ClassicSudokuVisualizer *local_38;
  
  uVar8 = (this->gitter).elements;
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (uVar8 != 0) {
    local_6c = 0;
    __val = 0;
    local_44 = uVar8;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar8 = 0;
      do {
        cVar4 = SudokuGitter::getCell(&local_38->gitter,local_6c,uVar8);
        uVar5 = cVar4.value;
        if (uVar5 == 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar3 = '\x01';
          if (9 < __val) {
            uVar7 = (ulong)__val;
            cVar2 = '\x04';
            do {
              cVar3 = cVar2;
              uVar5 = (uint)uVar7;
              if (uVar5 < 100) {
                cVar3 = cVar3 + -2;
                goto LAB_00112d50;
              }
              if (uVar5 < 1000) {
                cVar3 = cVar3 + -1;
                goto LAB_00112d50;
              }
              if (uVar5 < 10000) goto LAB_00112d50;
              uVar7 = uVar7 / 10000;
              cVar2 = cVar3 + '\x04';
            } while (99999 < uVar5);
            cVar3 = cVar3 + '\x01';
          }
LAB_00112d50:
          local_68 = local_58;
          std::__cxx11::string::_M_construct((ulong)&local_68,cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_68,local_60,__val);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar3 = '\x01';
          if (9 < __val) {
            uVar6 = __val;
            cVar2 = '\x04';
            do {
              cVar3 = cVar2;
              if (uVar6 < 100) {
                cVar3 = cVar3 + -2;
                goto LAB_00112c5c;
              }
              if (uVar6 < 1000) {
                cVar3 = cVar3 + -1;
                goto LAB_00112c5c;
              }
              if (uVar6 < 10000) goto LAB_00112c5c;
              bVar1 = 99999 < uVar6;
              uVar6 = uVar6 / 10000;
              cVar2 = cVar3 + '\x04';
            } while (bVar1);
            cVar3 = cVar3 + '\x01';
          }
LAB_00112c5c:
          local_68 = local_58;
          std::__cxx11::string::_M_construct((ulong)&local_68,cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_68,local_60,__val);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar3 = '\x01';
          if (9 < uVar5) {
            cVar2 = '\x04';
            do {
              cVar3 = cVar2;
              uVar6 = cVar4.value;
              if (uVar6 < 100) {
                cVar3 = cVar3 + -2;
                goto LAB_00112cfb;
              }
              if (uVar6 < 1000) {
                cVar3 = cVar3 + -1;
                goto LAB_00112cfb;
              }
              if (uVar6 < 10000) goto LAB_00112cfb;
              cVar4 = (cell)(((ulong)cVar4 & 0xffffffff) / 10000);
              cVar2 = cVar3 + '\x04';
            } while (99999 < uVar6);
            cVar3 = cVar3 + '\x01';
          }
LAB_00112cfb:
          local_68 = local_58;
          std::__cxx11::string::_M_construct((ulong)&local_68,cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_68,local_60,uVar5);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        __val = __val + 1;
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_44);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_6c = local_6c + 1;
    } while (local_6c != local_44);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ClassicSudokuVisualizer::createCells() {
    unsigned int size = gitter.getElements();

    std::string cells = "";

    unsigned int counter = 0;
    for (unsigned int row = 0; row < size; row++) {
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='cell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='cell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        cells.append("</tr>");
    }

    return cells;
}